

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDivl<(moira::Core)2,(moira::Instr)154,(moira::Mode)3,4>(Moira *this,u16 opcode)

{
  bool local_14;
  undefined1 local_13;
  u16 local_12;
  bool divByZero;
  bool success;
  Moira *pMStack_10;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  local_14 = false;
  local_12 = opcode;
  pMStack_10 = this;
  local_13 = execDivlMusashi<(moira::Core)2,(moira::Instr)154,(moira::Mode)3,4>
                       (this,opcode,&local_14);
  if ((bool)local_13) {
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x58));
  }
  else if ((local_14 & 1U) != 0) {
    (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x26));
  }
  return;
}

Assistant:

void
Moira::execDivl(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    bool success;
    bool divByZero = false;

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        success = execDivlMusashi<C, I, M, S>(opcode, &divByZero);
    } else {
        success = execDivlMoira<C, I, M, S>(opcode, &divByZero);
    }

    if (success) {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_DN   ( 0,  0,  0,        0,  0,  0,        0,  0, 84)
        CYCLES_AI   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_PI   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_PD   ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_DI   ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_IX   ( 0,  0,  0,        0,  0,  0,        0,  0, 91)
        CYCLES_AW   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_AL   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)
        CYCLES_DIPC ( 0,  0,  0,        0,  0,  0,        0,  0, 89)
        CYCLES_IXPC ( 0,  0,  0,        0,  0,  0,        0,  0, 91)
        CYCLES_IM   ( 0,  0,  0,        0,  0,  0,        0,  0, 88)

    } else if (divByZero) {

        CYCLES_68000(38);
        CYCLES_68010(44);
        CYCLES_68020(38);
    }

    FINALIZE
}